

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.h
# Opt level: O0

void __thiscall Symbol::~Symbol(Symbol *this)

{
  Symbol *this_local;
  
  ~Symbol(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~Symbol() {}